

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_functionApply
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionOperand,
               size_t argumentCount,int16_t *argumentOperands,int applicationFlags)

{
  int32_t iVar1;
  sysbvm_functionBytecode_t *bytecode;
  ulong *puVar2;
  _Bool _Var3;
  ulong uVar4;
  sysbvm_functionEntryPoint_t calledFunctionPointer;
  void *calledFunctionPointer_00;
  uint uVar5;
  sysbvm_x86_register_t reg;
  uint32_t primitiveNumber;
  undefined6 in_register_00000032;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  sysbvm_tuple_t literalFunction;
  uint8_t local_43 [4];
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined4 local_3c;
  ulong *local_38;
  
  local_3c = (undefined4)CONCAT62(in_register_00000032,resultOperand);
  local_38 = (ulong *)0x0;
  if (((applicationFlags & 1U) == 0) ||
     (_Var3 = sysbvm_bytecodeJit_getLiteralValueForOperand
                        (jit,functionOperand,(sysbvm_tuple_t *)&local_38), puVar2 = local_38, !_Var3
     )) goto LAB_0014aa65;
  bVar7 = local_38 == (ulong *)0x0;
  bVar8 = ((ulong)local_38 & 0xf) != 0;
  if (bVar8 || bVar7) goto LAB_0014aa65;
  uVar4 = *local_38;
  if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
    uVar4 = *(ulong *)(uVar4 + 0x70);
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar5 = (uint)((long)uVar4 >> 4);
    }
    else {
      uVar5 = (uint)*(undefined8 *)(uVar4 + 0x10);
    }
  }
  else {
    uVar5 = 0;
  }
  if ((uVar5 >> 0xc & 1) == 0) goto LAB_0014aa65;
  if (bVar8 || bVar7) {
LAB_0014a92e:
    uVar5 = 0;
  }
  else {
    uVar4 = *local_38;
    if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
      uVar4 = *(ulong *)(uVar4 + 0x70);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar5 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar5 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
    }
    else {
      uVar5 = 0;
    }
    if ((uVar5 >> 0xc & 1) == 0) goto LAB_0014a92e;
    uVar4 = local_38[5];
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar5 = (uint)((long)uVar4 >> 4);
    }
    else {
      uVar5 = (uint)*(undefined8 *)(uVar4 + 0x10);
    }
  }
  if ((uVar5 >> 9 & 1) != 0) goto LAB_0014aa65;
  if (bVar8 || bVar7) {
LAB_0014a9a1:
    uVar4 = 0;
  }
  else {
    uVar4 = *local_38;
    if (((uVar4 & 0xf) == 0 && uVar4 != 0) && ((*(byte *)(uVar4 + 8) & 0x80) == 0)) {
      uVar4 = *(ulong *)(uVar4 + 0x70);
      if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
        uVar5 = (uint)((long)uVar4 >> 4);
      }
      else {
        uVar5 = (uint)*(undefined8 *)(uVar4 + 0x10);
      }
    }
    else {
      uVar5 = 0;
    }
    if ((uVar5 >> 0xc & 1) == 0) goto LAB_0014a9a1;
    uVar4 = local_38[5];
    if (uVar4 == 0 || (uVar4 & 0xf) != 0) {
      uVar4 = (long)uVar4 >> 4;
    }
    else {
      uVar4 = *(ulong *)(uVar4 + 0x10);
    }
  }
  if ((uVar4 & 2) == 0) {
    uVar4 = local_38[10];
    if (uVar4 != 0) {
      if ((uVar4 & 0xf) == 0) {
        primitiveNumber = *(uint32_t *)(uVar4 + 0x10);
      }
      else {
        primitiveNumber = (uint32_t)(uVar4 >> 4);
      }
      calledFunctionPointer =
           sysbvm_function_getNumberedPrimitiveEntryPoint(jit->context,primitiveNumber);
      if (calledFunctionPointer != (sysbvm_functionEntryPoint_t)0x0) {
        sysbvm_jit_functionApplyDirectWithArgumentsRecord
                  (jit,(int16_t)local_3c,functionOperand,argumentCount,argumentOperands,
                   calledFunctionPointer);
        return;
      }
    }
    if ((((puVar2[9] != 0) &&
         (bytecode = *(sysbvm_functionBytecode_t **)(puVar2[9] + 0x80),
         bytecode != (sysbvm_functionBytecode_t *)0x0)) &&
        (bytecode != (sysbvm_functionBytecode_t *)0x5f)) &&
       (calledFunctionPointer_00 = sysbvm_jit_getTrampolineOrEntryPointForBytecode(jit,bytecode),
       calledFunctionPointer_00 != (void *)0x0)) {
      sysbvm_jit_functionApplyDirectVia
                (jit,(int16_t)local_3c,functionOperand,argumentCount,argumentOperands,
                 calledFunctionPointer_00);
      return;
    }
  }
LAB_0014aa65:
  if (argumentCount != 0) {
    sVar6 = 0;
    do {
      sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[sVar6],(int32_t)sVar6);
      sVar6 = sVar6 + 1;
    } while (argumentCount != sVar6);
  }
  iVar1 = jit->contextPointerOffset;
  local_43[0] = 'H';
  local_43[1] = 0x8b;
  local_43[2] = 0xbd;
  local_43[3] = (uint8_t)iVar1;
  local_3f = (undefined1)((uint)iVar1 >> 8);
  local_3e = (undefined1)((uint)iVar1 >> 0x10);
  local_3d = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,functionOperand);
  local_43[0] = 'H';
  local_43[1] = 199;
  local_43[2] = 0xc2;
  local_43[3] = (uint8_t)argumentCount;
  local_3f = (undefined1)(argumentCount >> 8);
  local_3e = (undefined1)(argumentCount >> 0x10);
  local_3d = (undefined1)(argumentCount >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  iVar1 = jit->callArgumentVectorOffset;
  local_43[0] = 'H';
  local_43[1] = 0x8d;
  local_43[2] = 0x8d;
  local_43[3] = (uint8_t)iVar1;
  local_3f = (undefined1)((uint)iVar1 >> 8);
  local_3e = (undefined1)((uint)iVar1 >> 0x10);
  local_3d = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  local_43[0] = 'I';
  local_43[1] = 199;
  local_43[2] = 0xc0;
  local_43[3] = (uint8_t)applicationFlags;
  local_3f = (undefined1)((uint)applicationFlags >> 8);
  local_3e = (undefined1)((uint)applicationFlags >> 0x10);
  local_3d = (undefined1)((uint)applicationFlags >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_43);
  sysbvm_jit_x86_call(jit,sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments);
  sysbvm_jit_moveRegisterToOperand(jit,(int16_t)local_3c,reg);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_functionApply(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    bool isNoTypecheck = applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK;

    // Are we calling a literal function?
    sysbvm_tuple_t literalFunction = SYSBVM_NULL_TUPLE;

    if(isNoTypecheck
        && sysbvm_bytecodeJit_getLiteralValueForOperand(jit, functionOperand, &literalFunction)
        && sysbvm_tuple_isFunction(jit->context, literalFunction)
        && !sysbvm_function_isMemoized(jit->context, literalFunction)
        && !sysbvm_function_isVariadic(jit->context, literalFunction))
    {
        // Is this a numbered primitive.
        sysbvm_function_t *literalFunctionObject = (sysbvm_function_t*)literalFunction;
        if(literalFunctionObject->primitiveTableIndex)
        {
            uint32_t primitiveNumber = sysbvm_tuple_uint32_decode(literalFunctionObject->primitiveTableIndex);
            sysbvm_functionEntryPoint_t entryPoint = sysbvm_function_getNumberedPrimitiveEntryPoint(jit->context, primitiveNumber);
            if(entryPoint)
            {
                sysbvm_jit_functionApplyDirectWithArgumentsRecord(jit, resultOperand, functionOperand, argumentCount, argumentOperands, entryPoint);
                return;
            }
        }
        
        if(literalFunctionObject->definition)
        {
            sysbvm_functionDefinition_t *literalFunctionDefinitionObject = (sysbvm_functionDefinition_t*)literalFunctionObject->definition;
            if(literalFunctionDefinitionObject->bytecode && literalFunctionDefinitionObject->bytecode != SYSBVM_PENDING_MEMOIZATION_VALUE)
            {
                void *trampolineOrEntryPoint = sysbvm_jit_getTrampolineOrEntryPointForBytecode(jit, (sysbvm_functionBytecode_t*)literalFunctionDefinitionObject->bytecode);
                if(trampolineOrEntryPoint)
                {
                    //printf("trampolineOrEntryPoint %p\n", trampolineOrEntryPoint);
                    sysbvm_jit_functionApplyDirectVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, trampolineOrEntryPoint);
                    return;
                }
            }
        }
    }

    sysbvm_jit_functionApplyVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, applicationFlags, &sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments);
}